

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

int signo(int A,int B)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = (B & A) >> ((byte)tp & 0x1f);
  uVar1 = tp + tq;
  if (tp + tq < 1) {
    uVar1 = 0;
  }
  uVar3 = 0;
  while (uVar1 != uVar3) {
    uVar4 = A >> ((byte)(uVar3 + 1) & 0x1f);
    if (((uint)B >> (uVar3 & 0x1f) & 1) == 0) {
      uVar4 = 0;
    }
    uVar2 = uVar2 ^ uVar4;
    uVar3 = uVar3 + 1;
  }
  uVar2 = uVar2 - ((uVar2 >> 3 & 0x11111111) + (uVar2 >> 2 & 0x33333333) + (uVar2 >> 1 & 0x77777777)
                  );
  return -((uint)(((ulong)((uVar2 >> 4) + uVar2) & 0xffffffff0f0f0f0f) % 0xff) & 1) | 1;
}

Assistant:

int signo(int A,int B)
{
	int sig=1;
	int tA2=((A>>tp)&(B>>tp));
	//int tA2=0; 
	for(register int i=0;i<(tp+tq);i++)
	{
		if((B>>i)&1)
			tA2=tA2^(A>>(i+1));
	}

	if(bits(tA2)&1){sig=-1;}

//return bits(tA2)&1;
return sig;
}